

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::embeddings_gradient
               (tensor *prev,tensor *gradient_input,tensor *grads,tensor *freqs,float learning_rate,
               bool scale)

{
  uint *puVar1;
  thread_pool_implementation *this;
  task_state_type *ptVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  thread_pool *this_00;
  unsigned_long uVar6;
  long lVar7;
  code *pcVar8;
  uint64 uVar9;
  ostream *poVar10;
  fatal_error *this_01;
  code *pcVar11;
  code *__stat_loc;
  code *pcVar12;
  bool scale_local;
  code *local_260;
  float learning_rate_local;
  thread_pool *local_250;
  code *local_248;
  long local_240;
  long nc;
  long nr;
  long nk;
  float *grads_data;
  float *freqs_data;
  float *gradient_input_data;
  float *prev_data;
  string local_200;
  helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2567:38)>_>
  local_1e0;
  vector<dlib::mutex,_std::allocator<dlib::mutex>_> embedding_mutexes;
  helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2567:38)>
  local_1b0;
  ostringstream dlib_o_out;
  tensor *local_190;
  tensor *local_188;
  float **local_180;
  bool *local_178;
  vector<dlib::mutex,_std::allocator<dlib::mutex>_> *local_170;
  long *local_168;
  float **local_160;
  tensor *local_158;
  float **local_150;
  float *local_148;
  
  scale_local = scale;
  learning_rate_local = learning_rate;
  if ((((((prev->m_nr < 1) || (gradient_input->m_n != prev->m_n)) ||
        (gradient_input->m_k != prev->m_k)) ||
       ((gradient_input->m_nr != prev->m_nr || (gradient_input->m_nc != grads->m_k)))) ||
      ((gradient_input->m_nc < 1 || ((grads->m_n < 1 || (grads->m_nr != 1)))))) ||
     (grads->m_nc != 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x9fd);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::embeddings_gradient(const tensor &, const tensor &, tensor &, const tensor &, float, bool)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,
                              "prev.nr() > 0 && gradient_input.num_samples() == prev.num_samples() && gradient_input.k() == prev.k() && gradient_input.nr() == prev.nr() && gradient_input.nc() == grads.k() && grads.num_samples() > 0 && grads.k() > 0 && grads.nr() == 1 && grads.nc() == 1"
                             );
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_190 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\ngradient_input.num_samples(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\ngradient_input.k(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\ngradient_input.nr(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\ngradient_input.nc(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\nprev.num_samples(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\nprev.k(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\nprev.nr(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\nprev.nc(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\ngrads.num_samples(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\ngrads.k(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\ngrads.nr(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    poVar10 = std::operator<<(poVar10,"\ngrads.nc(): ");
    poVar10 = std::ostream::_M_insert<long_long>((longlong)poVar10);
    std::operator<<(poVar10,"\n");
    this_01 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(this_01,EBROKEN_ASSERT,&local_200);
    __cxa_throw(this_01,&fatal_error::typeinfo,error::~error);
  }
  iVar5 = (*prev->_vptr_tensor[2])();
  prev_data = (float *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*gradient_input->_vptr_tensor[2])(gradient_input);
  gradient_input_data = (float *)CONCAT44(extraout_var_00,iVar5);
  iVar5 = (*freqs->_vptr_tensor[2])(freqs);
  freqs_data = (float *)CONCAT44(extraout_var_01,iVar5);
  iVar5 = (*grads->_vptr_tensor[3])(grads);
  grads_data = (float *)CONCAT44(extraout_var_02,iVar5);
  lVar7 = gradient_input->m_k;
  local_260 = (code *)gradient_input->m_n;
  nr = gradient_input->m_nr;
  nc = gradient_input->m_nc;
  __stat_loc = (code *)grads->m_n;
  nk = lVar7;
  std::vector<dlib::mutex,_std::allocator<dlib::mutex>_>::vector
            (&embedding_mutexes,(size_type)__stat_loc,(allocator_type *)&dlib_o_out);
  _dlib_o_out = &nk;
  local_180 = &freqs_data;
  local_178 = &scale_local;
  local_168 = &nc;
  local_160 = &gradient_input_data;
  local_150 = &grads_data;
  local_148 = &learning_rate_local;
  local_190 = prev;
  local_188 = grads;
  local_170 = &embedding_mutexes;
  local_158 = gradient_input;
  this_00 = default_thread_pool();
  local_1e0.obj = &local_1b0;
  local_1e0.funct =
       (offset_in_helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2567:38)>_to_subr
        )impl::
         helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2567:38)>
         ::run;
  local_1e0._16_8_ = 0;
  local_1b0.funct = (anon_class_104_13_45b05625 *)&dlib_o_out;
  uVar6 = thread_pool::num_threads_in_pool(this_00);
  pcVar11 = (code *)(lVar7 * (long)local_260);
  if (uVar6 == 0) {
    impl::
    helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2567:38)>_>
    ::process_block(&local_1e0,0,(long)pcVar11);
  }
  else {
    uVar6 = thread_pool::num_threads_in_pool(this_00);
    lVar7 = (long)pcVar11 / (long)(uVar6 << 3);
    local_240 = 1;
    if (1 < lVar7) {
      local_240 = lVar7;
    }
    pcVar8 = (code *)0x0;
    local_250 = this_00;
    local_248 = pcVar11;
    while ((long)pcVar8 < (long)local_248) {
      this = (local_250->impl).
             super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pcVar12 = pcVar8 + local_240;
      local_200._M_dataplus._M_p = (pointer)&this->m;
      local_200._M_string_length = 0;
      local_200.field_2._M_allocated_capacity = 0;
      pcVar11 = local_248;
      if ((long)pcVar12 < (long)local_248) {
        pcVar11 = pcVar12;
      }
      local_260 = pcVar8;
      pthread_mutex_lock((pthread_mutex_t *)local_200._M_dataplus._M_p);
      pcVar8 = (code *)pthread_self();
      lVar7 = thread_pool_implementation::find_empty_task_slot(this);
      if (lVar7 == -1) {
        __stat_loc = pcVar8;
        bVar4 = thread_pool_implementation::is_worker_thread(this,(thread_id_type)pcVar8);
        if (!bVar4) goto LAB_0016a581;
        auto_mutex::unlock((auto_mutex *)&local_200);
        __stat_loc = local_260;
        impl::
        helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2567:38)>_>
        ::process_block(&local_1e0,(long)local_260,(long)pcVar11);
      }
      else {
LAB_0016a581:
        while (lVar7 == -1) {
          signaler::wait(&this->task_done_signaler,__stat_loc);
          lVar7 = thread_pool_implementation::find_empty_task_slot(this);
        }
        (this->tasks).array_elements[lVar7].thread_id = (thread_id_type)pcVar8;
        uVar9 = thread_pool_implementation::make_next_task_id(this,lVar7);
        ptVar2 = (this->tasks).array_elements;
        ptVar2[lVar7].task_id = uVar9;
        (*(code *)**ptVar2[lVar7].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data)();
        puVar3 = (undefined8 *)ptVar2[lVar7].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data;
        __stat_loc = impl::
                     helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2567:38)>_>
                     ::process_block;
        puVar3[1] = &local_1e0;
        *(undefined4 *)(puVar3 + 2) = 0;
        puVar3[3] = impl::
                    helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2567:38)>_>
                    ::process_block;
        puVar3[4] = 0;
        *puVar3 = &PTR__mp_base_base_001fa778;
        ptVar2 = (this->tasks).array_elements;
        ptVar2[lVar7].arg1 = (long)local_260;
        ptVar2[lVar7].arg2 = (long)pcVar11;
        pthread_cond_signal((pthread_cond_t *)&(this->task_ready_signaler).cond);
      }
      auto_mutex::~auto_mutex((auto_mutex *)&local_200);
      pcVar8 = pcVar12;
    }
    thread_pool::wait_for_all_tasks(local_250);
  }
  std::vector<dlib::mutex,_std::allocator<dlib::mutex>_>::~vector(&embedding_mutexes);
  return;
}

Assistant:

void embeddings_gradient(
            const tensor& prev,
            const tensor& gradient_input,
            tensor& grads,
            const tensor& freqs,
            float learning_rate,
            bool scale
        )
        {
            DLIB_CASSERT(
                prev.nr() > 0 &&
                gradient_input.num_samples() == prev.num_samples() &&
                gradient_input.k() == prev.k() &&
                gradient_input.nr() == prev.nr() &&
                gradient_input.nc() == grads.k() &&
                grads.num_samples() > 0 &&
                grads.k() > 0 &&
                grads.nr() == 1 &&
                grads.nc() == 1,
                "\ngradient_input.num_samples(): " << gradient_input.num_samples() <<
                "\ngradient_input.k(): " << gradient_input.k() <<
                "\ngradient_input.nr(): " << gradient_input.nr() <<
                "\ngradient_input.nc(): " << gradient_input.nc() <<
                "\nprev.num_samples(): " << prev.num_samples() <<
                "\nprev.k(): " << prev.k() <<
                "\nprev.nr(): " << prev.nr() <<
                "\nprev.nc(): " << prev.nc() <<
                "\ngrads.num_samples(): " << grads.num_samples() <<
                "\ngrads.k(): " << grads.k() <<
                "\ngrads.nr(): " << grads.nr() <<
                "\ngrads.nc(): " << grads.nc()
            );

            const float* prev_data = prev.host();
            const float* gradient_input_data = gradient_input.host();
            const float* freqs_data = freqs.host();
            float* grads_data = grads.host();
            long ns = gradient_input.num_samples(), nk = gradient_input.k();
            long nr = gradient_input.nr(), nc = gradient_input.nc();

            std::vector<dlib::mutex> embedding_mutexes(grads.num_samples());
            parallel_for(0, ns * nk, [&](long i)
                {
                    long s = i / nk;
                    long k = i % nk;

                    for (long r = 0; r < nr; ++r)
                    {
                        const unsigned long token_idx = static_cast<unsigned long>(prev_data[tensor_index(prev, s, k, r, 0)]);
                        if (token_idx < grads.num_samples())
                        {
                            const float freg_token = freqs_data[token_idx];
                            float freq_scale = 1.0f;

                            if (scale && freg_token != 0.0f) freq_scale = std::min(0.15f, std::max(1.0f / freg_token, 1.0f));
                            auto_mutex locker(embedding_mutexes[token_idx]);
                            for (long c = 0; c < nc; ++c)
                            {
                                const float gradient = gradient_input_data[tensor_index(gradient_input, s, k, r, c)];
                                grads_data[tensor_index(grads, token_idx, c, 0, 0)] -= (gradient * learning_rate * freq_scale);
                            }
                        }
                    }
                });
        }